

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,OutputPartData *part)

{
  size_t __n;
  int iVar1;
  string *psVar2;
  Data *pDVar3;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_001e31e8;
  psVar2 = Header::type_abi_cxx11_(&part->header);
  __n = psVar2->_M_string_length;
  if (__n == DAT_001e7c38) {
    if (__n != 0) {
      iVar1 = bcmp((psVar2->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
      if (iVar1 != 0) goto LAB_0016b018;
    }
    pDVar3 = (Data *)operator_new(0x180);
    Data::Data(pDVar3,part->numThreads);
    this->_data = pDVar3;
    pDVar3->_streamData = part->mutex;
    pDVar3->_deleteStream = false;
    initialize(this,&part->header);
    pDVar3 = this->_data;
    pDVar3->partNumber = part->partNumber;
    pDVar3->lineOffsetsPosition = part->chunkOffsetTablePosition;
    pDVar3->previewPosition = part->previewPosition;
    pDVar3->multipart = part->multipart;
    return;
  }
LAB_0016b018:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (this_00,"Can\'t build a DeepScanLineOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile (const OutputPartData* part)
{
    try
    {
        if (part->header.type () != DEEPSCANLINE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a DeepScanLineOutputFile from a type-mismatched part.");

        _data                = new Data (part->numThreads);
        _data->_streamData   = part->mutex;
        _data->_deleteStream = false;
        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->lineOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
        _data->multipart           = part->multipart;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}